

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O0

string * wasm::escape(string *__return_storage_ptr__,string *code)

{
  ulong uVar1;
  string *psVar2;
  char *pcVar3;
  size_t curr;
  string *code_local;
  
  while (uVar1 = std::__cxx11::string::find((char *)code,0x294d55a), uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x2);
    std::__cxx11::string::operator=((string *)code,psVar2);
  }
  while (uVar1 = std::__cxx11::string::find((char *)code,0x294d55e), uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x2);
    std::__cxx11::string::operator=((string *)code,psVar2);
  }
  while (uVar1 = std::__cxx11::string::find((char)code,0x22), uVar1 != 0xffffffffffffffff) {
    if ((uVar1 == 0) ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)code), *pcVar3 != '\\')) {
      psVar2 = (string *)std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x1);
      std::__cxx11::string::operator=((string *)code,psVar2);
    }
    else {
      psVar2 = (string *)std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x1);
      std::__cxx11::string::operator=((string *)code,psVar2);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)code);
  return __return_storage_ptr__;
}

Assistant:

std::string escape(std::string code) {
  // replace newlines quotes with escaped newlines
  size_t curr = 0;
  while ((curr = code.find("\\n", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\n");
    curr += 3; // skip this one
  }
  curr = 0;
  while ((curr = code.find("\\t", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\t");
    curr += 3; // skip this one
  }
  // replace double quotes with escaped single quotes
  curr = 0;
  while ((curr = code.find('"', curr)) != std::string::npos) {
    if (curr == 0 || code[curr - 1] != '\\') {
      code = code.replace(curr,
                          1,
                          "\\"
                          "\"");
      curr += 2; // skip this one
    } else {     // already escaped, escape the slash as well
      code = code.replace(curr,
                          1,
                          "\\"
                          "\\"
                          "\"");
      curr += 3; // skip this one
    }
  }
  return code;
}